

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rulebasedcollator.cpp
# Opt level: O2

UCollationResult __thiscall
icu_63::RuleBasedCollator::compare
          (RuleBasedCollator *this,UnicodeString *left,UnicodeString *right,int32_t length,
          UErrorCode *errorCode)

{
  short sVar1;
  int iVar2;
  UCollationResult UVar3;
  char16_t *left_00;
  char16_t *right_00;
  int32_t leftLength;
  
  if ((length != 0) && (*errorCode < U_ILLEGAL_ARGUMENT_ERROR)) {
    if (-1 < length) {
      sVar1 = (left->fUnion).fStackFields.fLengthAndFlags;
      if (sVar1 < 0) {
        leftLength = (left->fUnion).fFields.fLength;
      }
      else {
        leftLength = (int)sVar1 >> 5;
      }
      sVar1 = (right->fUnion).fStackFields.fLengthAndFlags;
      if (sVar1 < 0) {
        iVar2 = (right->fUnion).fFields.fLength;
      }
      else {
        iVar2 = (int)sVar1 >> 5;
      }
      if (length <= leftLength) {
        leftLength = length;
      }
      if (iVar2 < length) {
        length = iVar2;
      }
      left_00 = UnicodeString::getBuffer(left);
      right_00 = UnicodeString::getBuffer(right);
      UVar3 = doCompare(this,left_00,leftLength,right_00,length,errorCode);
      return UVar3;
    }
    *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
  }
  return UCOL_EQUAL;
}

Assistant:

UCollationResult
RuleBasedCollator::compare(const UnicodeString &left, const UnicodeString &right,
                           int32_t length, UErrorCode &errorCode) const {
    if(U_FAILURE(errorCode) || length == 0) { return UCOL_EQUAL; }
    if(length < 0) {
        errorCode = U_ILLEGAL_ARGUMENT_ERROR;
        return UCOL_EQUAL;
    }
    int32_t leftLength = left.length();
    int32_t rightLength = right.length();
    if(leftLength > length) { leftLength = length; }
    if(rightLength > length) { rightLength = length; }
    return doCompare(left.getBuffer(), leftLength,
                     right.getBuffer(), rightLength, errorCode);
}